

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_string
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  byte __rhs;
  size_t sVar1;
  JSON *pJVar2;
  char __c;
  char *pcVar3;
  const_reference pvVar4;
  byte *pbVar5;
  runtime_error *this;
  long lVar6;
  allocator<char> local_d9;
  JSON *local_d8;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  sVar1 = *offset;
  *offset = sVar1 + 1;
  local_d8 = __return_storage_ptr__;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,sVar1 + 1);
  do {
    __c = *pcVar3;
    if (__c != '\\') {
      if (__c == '\"') {
        *offset = *offset + 1;
        std::__cxx11::string::string((string *)&local_b0,&val);
        pJVar2 = local_d8;
        JSON::JSON<std::__cxx11::string>(local_d8,&local_b0,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&val);
        return pJVar2;
      }
      goto LAB_0034b5dd;
    }
    sVar1 = *offset;
    *offset = sVar1 + 1;
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,sVar1 + 1);
    __c = *pvVar4;
    switch(__c) {
    case 'n':
      __c = '\n';
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_0034b643_caseD_6f:
      __c = '\\';
      break;
    case 'r':
      __c = '\r';
      break;
    case 't':
      __c = '\t';
      break;
    case 'u':
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&val,"\\u");
      for (lVar6 = 1; lVar6 != 5; lVar6 = lVar6 + 1) {
        pbVar5 = (byte *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                                   (str,*offset + lVar6);
        __rhs = *pbVar5;
        if ((9 < (byte)(__rhs - 0x30)) &&
           ((0x25 < __rhs - 0x41 || ((0x3f0000003fU >> ((ulong)(__rhs - 0x41) & 0x3f) & 1) == 0))))
        {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,
                     "JSON ERROR: String: Expected hex character in unicode escape, found \'",
                     &local_d9);
          std::operator+(&local_70,&local_90,__rhs);
          std::operator+(&local_50,&local_70,"\'");
          std::runtime_error::runtime_error(this,(string *)&local_50);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&val,__rhs);
      }
      *offset = *offset + 4;
      goto LAB_0034b5e8;
    default:
      if ((__c != '\"') && (__c != '/')) {
        if (__c == 'f') {
          __c = '\f';
        }
        else if (__c == 'b') {
          __c = '\b';
        }
        else if (__c != '\\') goto switchD_0034b643_caseD_6f;
      }
    }
LAB_0034b5dd:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&val,__c);
LAB_0034b5e8:
    sVar1 = *offset;
    *offset = sVar1 + 1;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,sVar1 + 1);
  } while( true );
}

Assistant:

static JSON parse_string(const std::string &str, size_t &offset) {
      std::string val;
      for (char c = str.at(++offset); c != '\"'; c = str.at(++offset)) {
        if (c == '\\') {
          switch (str.at(++offset)) {
            case '\"':
              val += '\"';
              break;
            case '\\':
              val += '\\';
              break;
            case '/':
              val += '/';
              break;
            case 'b':
              val += '\b';
              break;
            case 'f':
              val += '\f';
              break;
            case 'n':
              val += '\n';
              break;
            case 'r':
              val += '\r';
              break;
            case 't':
              val += '\t';
              break;
            case 'u': {
              val += "\\u";
              for (size_t i = 1; i <= 4; ++i) {
                c = str.at(offset + i);
                if ((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')) {
                  val += c;
                } else {
                  throw std::runtime_error(
                      std::string("JSON ERROR: String: Expected hex character in unicode escape, found '") + c + "'");
                }
              }
              offset += 4;
            } break;
            default:
              val += '\\';
              break;
          }
        } else {
          val += c;
        }
      }
      ++offset;
      return JSON(val);
    }